

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

void __thiscall cnn::ComputationGraph::~ComputationGraph(ComputationGraph *this)

{
  pointer pVVar1;
  pointer ppNVar2;
  
  clear(this);
  if (this->ee != (ExecutionEngine *)0x0) {
    (*this->ee->_vptr_ExecutionEngine[1])();
  }
  n_hgs = n_hgs + -1;
  pVVar1 = (this->parameter_nodes).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  ppNVar2 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2);
    return;
  }
  return;
}

Assistant:

ComputationGraph::~ComputationGraph() {
  this->clear();
  delete ee;
  --n_hgs;
}